

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall tcu::Texture1DArray::Texture1DArray(Texture1DArray *this,Texture1DArray *other)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  Texture1DArray *other_local;
  Texture1DArray *this_local;
  
  TextureLevelPyramid::TextureLevelPyramid
            (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
  this->m_width = other->m_width;
  this->m_numLayers = other->m_numLayers;
  numLevels = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
  levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
            super_ConstPixelBufferAccess;
  Texture1DArrayView::Texture1DArrayView(&this->m_view,numLevels,levels);
  return;
}

Assistant:

Texture1DArray::Texture1DArray (const Texture1DArray& other)
	: TextureLevelPyramid	(other)
	, m_width				(other.m_width)
	, m_numLayers			(other.m_numLayers)
	, m_view				(getNumLevels(), getLevels())
{
}